

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# period.cc
# Opt level: O3

int main(int argc,char **argv)

{
  double dVar1;
  time_t tVar2;
  time_t tVar3;
  datetime d;
  tm temp;
  period period;
  accessor<3600UL> everyhour;
  datetime n;
  tm local_278;
  double local_238;
  undefined8 uStack_230;
  tm local_228;
  ulong local_1f0;
  long lStack_1e8;
  int local_1e0;
  int iStack_1dc;
  int iStack_1d8;
  int iStack_1d4;
  int local_1d0;
  undefined4 uStack_1cc;
  long lStack_1c8;
  char *local_1c0;
  ulong local_1b8;
  long lStack_1b0;
  int local_1a8;
  int iStack_1a4;
  int iStack_1a0;
  int iStack_19c;
  int local_198;
  undefined4 uStack_194;
  long lStack_190;
  char *local_188;
  double local_180;
  period local_178;
  accessor<3600UL> local_108;
  accessor<3600UL> local_f8;
  iterator local_e8;
  
  setlocale(6,"");
  local_e8.now.when._0_8_ = time((time_t *)0x0);
  local_228.tm_sec = 0;
  local_228.tm_min = 0;
  local_228.tm_hour = 0;
  local_228.tm_mday = 0;
  local_228.tm_mon = 0;
  local_228.tm_year = 0;
  local_228.tm_wday = 0;
  local_228.tm_yday = 0;
  local_228.tm_isdst = 0;
  local_228._36_4_ = 0;
  local_228.tm_gmtoff = 0;
  local_228.tm_zone = (char *)0x0;
  localtime_r((time_t *)&local_e8,&local_228);
  local_178.begin_.when._0_8_ = time((time_t *)0x0);
  local_e8.now.when.tm_sec = 0;
  local_e8.now.when.tm_min = 0;
  local_e8.now.when.tm_hour = 0;
  local_e8.now.when.tm_mday = 0;
  local_e8.now.when.tm_mon = 0;
  local_e8.now.when.tm_year = 0;
  local_e8.now.when.tm_wday = 0;
  local_e8.now.when.tm_yday = 0;
  local_e8.now.when.tm_isdst = 0;
  local_e8.now.when._36_4_ = 0;
  local_e8.now.when.tm_gmtoff = 0;
  local_e8.now.when.tm_zone = (char *)0x0;
  localtime_r((time_t *)&local_178,(tm *)&local_e8);
  local_e8.now.when.tm_mday = local_e8.now.when.tm_mday + 1;
  mktime((tm *)&local_e8);
  local_e8.now.when._8_8_ = (ulong)(uint)local_e8.now.when.tm_mday << 0x20;
  mktime((tm *)&local_e8);
  local_e8.now.when._0_8_ = local_e8.now.when._0_8_ & 0xffffffff;
  mktime((tm *)&local_e8);
  local_e8.now.when._0_8_ = local_e8.now.when._0_8_ & 0xffffffff00000000;
  mktime((tm *)&local_e8);
  local_178.begin_.when.tm_sec = local_228.tm_sec;
  local_178.begin_.when.tm_min = local_228.tm_min;
  local_178.begin_.when.tm_hour = local_228.tm_hour;
  local_178.begin_.when.tm_mday = local_228.tm_mday;
  local_178.begin_.when.tm_mon = local_228.tm_mon;
  local_178.begin_.when.tm_year = local_228.tm_year;
  local_178.begin_.when.tm_wday = local_228.tm_wday;
  local_178.begin_.when.tm_yday = local_228.tm_yday;
  local_178.begin_.when.tm_isdst = local_228.tm_isdst;
  local_178.begin_.when._36_4_ = local_228._36_4_;
  local_178.begin_.when.tm_gmtoff = local_228.tm_gmtoff;
  local_178.begin_.when.tm_zone = local_228.tm_zone;
  local_178.end_.when.tm_sec = local_e8.now.when.tm_sec;
  local_178.end_.when.tm_min = local_e8.now.when.tm_min;
  local_178.end_.when.tm_hour = local_e8.now.when.tm_hour;
  local_178.end_.when.tm_mday = local_e8.now.when.tm_mday;
  local_178.end_.when.tm_mon = local_e8.now.when.tm_mon;
  local_178.end_.when.tm_year = local_e8.now.when.tm_year;
  local_178.end_.when.tm_wday = local_e8.now.when.tm_wday;
  local_178.end_.when.tm_yday = local_e8.now.when.tm_yday;
  local_178.end_.when.tm_isdst = local_e8.now.when.tm_isdst;
  local_178.end_.when._36_4_ = local_e8.now.when._36_4_;
  local_178.end_.when.tm_gmtoff = local_e8.now.when.tm_gmtoff;
  local_178.end_.when.tm_zone = local_e8.now.when.tm_zone;
  local_f8.step.value = 1.0;
  local_f8.range = &local_178;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"every hour until tomorrow:",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_228.tm_zone = local_178.begin_.when.tm_zone;
  local_228.tm_isdst = local_178.begin_.when.tm_isdst;
  local_228._36_4_ = local_178.begin_.when._36_4_;
  local_228.tm_gmtoff = local_178.begin_.when.tm_gmtoff;
  local_228.tm_mon = local_178.begin_.when.tm_mon;
  local_228.tm_year = local_178.begin_.when.tm_year;
  local_228.tm_wday = local_178.begin_.when.tm_wday;
  local_228.tm_yday = local_178.begin_.when.tm_yday;
  local_228.tm_sec = local_178.begin_.when.tm_sec;
  local_228.tm_min = local_178.begin_.when.tm_min;
  local_228.tm_hour = local_178.begin_.when.tm_hour;
  local_228.tm_mday = local_178.begin_.when.tm_mday;
  tVar2 = mktime(&local_228);
  local_228.tm_zone = local_178.end_.when.tm_zone;
  local_228.tm_isdst = local_178.end_.when.tm_isdst;
  local_228._36_4_ = local_178.end_.when._36_4_;
  local_228.tm_gmtoff = local_178.end_.when.tm_gmtoff;
  local_228.tm_mon = local_178.end_.when.tm_mon;
  local_228.tm_year = local_178.end_.when.tm_year;
  local_228.tm_wday = local_178.end_.when.tm_wday;
  local_228.tm_yday = local_178.end_.when.tm_yday;
  local_228.tm_sec = local_178.end_.when.tm_sec;
  local_228.tm_min = local_178.end_.when.tm_min;
  local_228.tm_hour = local_178.end_.when.tm_hour;
  local_228.tm_mday = local_178.end_.when.tm_mday;
  tVar3 = mktime(&local_228);
  if (tVar3 < tVar2) {
    local_e8.now.when.tm_zone = local_178.begin_.when.tm_zone;
    local_e8.now.when.tm_isdst = local_178.begin_.when.tm_isdst;
    local_e8.now.when._36_4_ = local_178.begin_.when._36_4_;
    local_e8.now.when.tm_gmtoff = local_178.begin_.when.tm_gmtoff;
    local_e8.now.when.tm_mon = local_178.begin_.when.tm_mon;
    local_e8.now.when.tm_year = local_178.begin_.when.tm_year;
    local_e8.now.when.tm_wday = local_178.begin_.when.tm_wday;
    local_e8.now.when.tm_yday = local_178.begin_.when.tm_yday;
    local_e8.now.when.tm_sec = local_178.begin_.when.tm_sec;
    local_e8.now.when.tm_min = local_178.begin_.when.tm_min;
    local_e8.now.when.tm_hour = local_178.begin_.when.tm_hour;
    local_e8.now.when.tm_mday = local_178.begin_.when.tm_mday;
    tVar2 = mktime((tm *)&local_e8);
    local_278._0_8_ = tVar2 - 1;
    localtime_r((time_t *)&local_278,(tm *)&local_e8);
    local_1c0 = local_178.end_.when.tm_zone;
    local_1d0 = local_178.end_.when.tm_isdst;
    uStack_1cc = local_178.end_.when._36_4_;
    lStack_1c8 = local_178.end_.when.tm_gmtoff;
    local_1e0 = local_178.end_.when.tm_mon;
    iStack_1dc = local_178.end_.when.tm_year;
    iStack_1d8 = local_178.end_.when.tm_wday;
    iStack_1d4 = local_178.end_.when.tm_yday;
    local_1f0._0_4_ = local_178.end_.when.tm_sec;
    local_1f0._4_4_ = local_178.end_.when.tm_min;
    lStack_1e8._0_4_ = local_178.end_.when.tm_hour;
    lStack_1e8._4_4_ = local_178.end_.when.tm_mday;
  }
  else {
    local_e8.now.when.tm_zone = local_178.end_.when.tm_zone;
    local_e8.now.when.tm_isdst = local_178.end_.when.tm_isdst;
    local_e8.now.when._36_4_ = local_178.end_.when._36_4_;
    local_e8.now.when.tm_gmtoff = local_178.end_.when.tm_gmtoff;
    local_e8.now.when.tm_mon = local_178.end_.when.tm_mon;
    local_e8.now.when.tm_year = local_178.end_.when.tm_year;
    local_e8.now.when.tm_wday = local_178.end_.when.tm_wday;
    local_e8.now.when.tm_yday = local_178.end_.when.tm_yday;
    local_e8.now.when.tm_sec = local_178.end_.when.tm_sec;
    local_e8.now.when.tm_min = local_178.end_.when.tm_min;
    local_e8.now.when.tm_hour = local_178.end_.when.tm_hour;
    local_e8.now.when.tm_mday = local_178.end_.when.tm_mday;
    tVar2 = mktime((tm *)&local_e8);
    local_278._0_8_ = tVar2 + 1;
    localtime_r((time_t *)&local_278,(tm *)&local_e8);
    local_1c0 = local_178.begin_.when.tm_zone;
    local_1d0 = local_178.begin_.when.tm_isdst;
    uStack_1cc = local_178.begin_.when._36_4_;
    lStack_1c8 = local_178.begin_.when.tm_gmtoff;
    local_1e0 = local_178.begin_.when.tm_mon;
    iStack_1dc = local_178.begin_.when.tm_year;
    iStack_1d8 = local_178.begin_.when.tm_wday;
    iStack_1d4 = local_178.begin_.when.tm_yday;
    local_1f0._0_4_ = local_178.begin_.when.tm_sec;
    local_1f0._4_4_ = local_178.begin_.when.tm_min;
    lStack_1e8._0_4_ = local_178.begin_.when.tm_hour;
    lStack_1e8._4_4_ = local_178.begin_.when.tm_mday;
  }
  local_180 = 1.0;
  local_228._0_8_ = local_1f0;
  local_228._8_8_ = lStack_1e8;
  local_228._16_8_ = _local_1e0;
  local_228._24_8_ = _iStack_1d8;
  local_228._32_8_ = _local_1d0;
  local_228.tm_gmtoff = lStack_1c8;
  local_228.tm_zone = local_1c0;
  local_1b8 = local_e8.now.when._0_8_;
  lStack_1b0 = local_e8.now.when._8_8_;
  _local_1a8 = local_e8.now.when._16_8_;
  _iStack_1a0 = local_e8.now.when._24_8_;
  _local_198 = local_e8.now.when._32_8_;
  lStack_190 = local_e8.now.when.tm_gmtoff;
  local_188 = local_e8.now.when.tm_zone;
  while( true ) {
    asap::detail::accessor<3600UL>::end(&local_e8,&local_f8);
    local_278.tm_zone = local_e8.now.when.tm_zone;
    local_278.tm_isdst = local_e8.now.when.tm_isdst;
    local_278._36_4_ = local_e8.now.when._36_4_;
    local_278.tm_gmtoff = local_e8.now.when.tm_gmtoff;
    local_278.tm_mon = local_e8.now.when.tm_mon;
    local_278.tm_year = local_e8.now.when.tm_year;
    local_278.tm_wday = local_e8.now.when.tm_wday;
    local_278.tm_yday = local_e8.now.when.tm_yday;
    local_278.tm_sec = local_e8.now.when.tm_sec;
    local_278.tm_min = local_e8.now.when.tm_min;
    local_278.tm_hour = local_e8.now.when.tm_hour;
    local_278.tm_mday = local_e8.now.when.tm_mday;
    tVar2 = mktime(&local_278);
    local_278.tm_zone = local_228.tm_zone;
    local_278.tm_isdst = local_228.tm_isdst;
    local_278._36_4_ = local_228._36_4_;
    local_278.tm_gmtoff = local_228.tm_gmtoff;
    local_278.tm_mon = local_228.tm_mon;
    local_278.tm_year = local_228.tm_year;
    local_278.tm_wday = local_228.tm_wday;
    local_278.tm_yday = local_228.tm_yday;
    local_278.tm_sec = local_228.tm_sec;
    local_278.tm_min = local_228.tm_min;
    local_278.tm_hour = local_228.tm_hour;
    local_278.tm_mday = local_228.tm_mday;
    tVar3 = mktime(&local_278);
    if (tVar2 == tVar3) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
    asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (datetime *)&local_228);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    local_238 = local_180;
    uStack_230 = 0;
    local_228.tm_hour = local_228.tm_hour + (int)local_180;
    dVar1 = floor(local_180);
    local_238 = (local_238 - dVar1) * 60.0;
    dVar1 = floor(local_238);
    local_228._0_8_ =
         CONCAT44(local_228.tm_min + (int)local_238,
                  local_228.tm_sec + (int)((local_238 - dVar1) * 60.0));
    mktime(&local_228);
    local_e8.now.when.tm_zone = local_228.tm_zone;
    local_e8.now.when.tm_isdst = local_228.tm_isdst;
    local_e8.now.when._36_4_ = local_228._36_4_;
    local_e8.now.when.tm_gmtoff = local_228.tm_gmtoff;
    local_e8.now.when.tm_mon = local_228.tm_mon;
    local_e8.now.when.tm_year = local_228.tm_year;
    local_e8.now.when.tm_wday = local_228.tm_wday;
    local_e8.now.when.tm_yday = local_228.tm_yday;
    local_e8.now.when.tm_sec = local_228.tm_sec;
    local_e8.now.when.tm_min = local_228.tm_min;
    local_e8.now.when.tm_hour = local_228.tm_hour;
    local_e8.now.when.tm_mday = local_228.tm_mday;
    tVar2 = mktime((tm *)&local_e8);
    local_e8.now.when.tm_zone = local_188;
    local_e8.now.when.tm_isdst = local_198;
    local_e8.now.when._36_4_ = uStack_194;
    local_e8.now.when.tm_gmtoff = lStack_190;
    local_e8.now.when.tm_mon = local_1a8;
    local_e8.now.when.tm_year = iStack_1a4;
    local_e8.now.when.tm_wday = iStack_1a0;
    local_e8.now.when.tm_yday = iStack_19c;
    local_e8.now.when.tm_sec = (undefined4)local_1b8;
    local_e8.now.when.tm_min = local_1b8._4_4_;
    local_e8.now.when.tm_hour = (undefined4)lStack_1b0;
    local_e8.now.when.tm_mday = lStack_1b0._4_4_;
    tVar3 = mktime((tm *)&local_e8);
    if (tVar3 < tVar2) {
      local_228.tm_zone = local_188;
      local_228._0_8_ = local_1b8;
      local_228._8_8_ = lStack_1b0;
      local_228.tm_mon = local_1a8;
      local_228.tm_year = iStack_1a4;
      local_228.tm_wday = iStack_1a0;
      local_228.tm_yday = iStack_19c;
      local_228.tm_isdst = local_198;
      local_228._36_4_ = uStack_194;
      local_228.tm_gmtoff = lStack_190;
    }
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"every 3 hours until tomorrow:",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_108.range = &local_178;
  local_108.step.value = 3.0;
  local_228.tm_zone = local_178.begin_.when.tm_zone;
  local_228.tm_isdst = local_178.begin_.when.tm_isdst;
  local_228._36_4_ = local_178.begin_.when._36_4_;
  local_228.tm_gmtoff = local_178.begin_.when.tm_gmtoff;
  local_228.tm_mon = local_178.begin_.when.tm_mon;
  local_228.tm_year = local_178.begin_.when.tm_year;
  local_228.tm_wday = local_178.begin_.when.tm_wday;
  local_228.tm_yday = local_178.begin_.when.tm_yday;
  local_228.tm_sec = local_178.begin_.when.tm_sec;
  local_228.tm_min = local_178.begin_.when.tm_min;
  local_228.tm_hour = local_178.begin_.when.tm_hour;
  local_228.tm_mday = local_178.begin_.when.tm_mday;
  tVar2 = mktime(&local_228);
  local_228.tm_zone = local_178.end_.when.tm_zone;
  local_228.tm_isdst = local_178.end_.when.tm_isdst;
  local_228._36_4_ = local_178.end_.when._36_4_;
  local_228.tm_gmtoff = local_178.end_.when.tm_gmtoff;
  local_228.tm_mon = local_178.end_.when.tm_mon;
  local_228.tm_year = local_178.end_.when.tm_year;
  local_228.tm_wday = local_178.end_.when.tm_wday;
  local_228.tm_yday = local_178.end_.when.tm_yday;
  local_228.tm_sec = local_178.end_.when.tm_sec;
  local_228.tm_min = local_178.end_.when.tm_min;
  local_228.tm_hour = local_178.end_.when.tm_hour;
  local_228.tm_mday = local_178.end_.when.tm_mday;
  tVar3 = mktime(&local_228);
  if (tVar3 < tVar2) {
    local_e8.now.when.tm_zone = local_178.begin_.when.tm_zone;
    local_e8.now.when.tm_isdst = local_178.begin_.when.tm_isdst;
    local_e8.now.when._36_4_ = local_178.begin_.when._36_4_;
    local_e8.now.when.tm_gmtoff = local_178.begin_.when.tm_gmtoff;
    local_e8.now.when.tm_mon = local_178.begin_.when.tm_mon;
    local_e8.now.when.tm_year = local_178.begin_.when.tm_year;
    local_e8.now.when.tm_wday = local_178.begin_.when.tm_wday;
    local_e8.now.when.tm_yday = local_178.begin_.when.tm_yday;
    local_e8.now.when.tm_sec = local_178.begin_.when.tm_sec;
    local_e8.now.when.tm_min = local_178.begin_.when.tm_min;
    local_e8.now.when.tm_hour = local_178.begin_.when.tm_hour;
    local_e8.now.when.tm_mday = local_178.begin_.when.tm_mday;
    tVar2 = mktime((tm *)&local_e8);
    local_278._0_8_ = tVar2 + -1;
    localtime_r((time_t *)&local_278,(tm *)&local_e8);
    local_1c0 = local_178.end_.when.tm_zone;
    local_1d0 = local_178.end_.when.tm_isdst;
    uStack_1cc = local_178.end_.when._36_4_;
    lStack_1c8 = local_178.end_.when.tm_gmtoff;
    local_1e0 = local_178.end_.when.tm_mon;
    iStack_1dc = local_178.end_.when.tm_year;
    iStack_1d8 = local_178.end_.when.tm_wday;
    iStack_1d4 = local_178.end_.when.tm_yday;
    local_1f0._0_4_ = local_178.end_.when.tm_sec;
    local_1f0._4_4_ = local_178.end_.when.tm_min;
    lStack_1e8._0_4_ = local_178.end_.when.tm_hour;
    lStack_1e8._4_4_ = local_178.end_.when.tm_mday;
  }
  else {
    local_e8.now.when.tm_zone = local_178.end_.when.tm_zone;
    local_e8.now.when.tm_isdst = local_178.end_.when.tm_isdst;
    local_e8.now.when._36_4_ = local_178.end_.when._36_4_;
    local_e8.now.when.tm_gmtoff = local_178.end_.when.tm_gmtoff;
    local_e8.now.when.tm_mon = local_178.end_.when.tm_mon;
    local_e8.now.when.tm_year = local_178.end_.when.tm_year;
    local_e8.now.when.tm_wday = local_178.end_.when.tm_wday;
    local_e8.now.when.tm_yday = local_178.end_.when.tm_yday;
    local_e8.now.when.tm_sec = local_178.end_.when.tm_sec;
    local_e8.now.when.tm_min = local_178.end_.when.tm_min;
    local_e8.now.when.tm_hour = local_178.end_.when.tm_hour;
    local_e8.now.when.tm_mday = local_178.end_.when.tm_mday;
    tVar2 = mktime((tm *)&local_e8);
    local_278._0_8_ = tVar2 + 1;
    localtime_r((time_t *)&local_278,(tm *)&local_e8);
    local_1c0 = local_178.begin_.when.tm_zone;
    local_1d0 = local_178.begin_.when.tm_isdst;
    uStack_1cc = local_178.begin_.when._36_4_;
    lStack_1c8 = local_178.begin_.when.tm_gmtoff;
    local_1e0 = local_178.begin_.when.tm_mon;
    iStack_1dc = local_178.begin_.when.tm_year;
    iStack_1d8 = local_178.begin_.when.tm_wday;
    iStack_1d4 = local_178.begin_.when.tm_yday;
    local_1f0._0_4_ = local_178.begin_.when.tm_sec;
    local_1f0._4_4_ = local_178.begin_.when.tm_min;
    lStack_1e8._0_4_ = local_178.begin_.when.tm_hour;
    lStack_1e8._4_4_ = local_178.begin_.when.tm_mday;
  }
  local_180 = 3.0;
  local_228._0_8_ = local_1f0;
  local_228._8_8_ = lStack_1e8;
  local_228._16_8_ = _local_1e0;
  local_228._24_8_ = _iStack_1d8;
  local_228._32_8_ = _local_1d0;
  local_228.tm_gmtoff = lStack_1c8;
  local_228.tm_zone = local_1c0;
  local_1b8 = local_e8.now.when._0_8_;
  lStack_1b0 = local_e8.now.when._8_8_;
  _local_1a8 = local_e8.now.when._16_8_;
  _iStack_1a0 = local_e8.now.when._24_8_;
  _local_198 = local_e8.now.when._32_8_;
  lStack_190 = local_e8.now.when.tm_gmtoff;
  local_188 = local_e8.now.when.tm_zone;
  asap::detail::accessor<3600UL>::end(&local_e8,&local_108);
  local_278.tm_zone = local_e8.now.when.tm_zone;
  local_278.tm_isdst = local_e8.now.when.tm_isdst;
  local_278._36_4_ = local_e8.now.when._36_4_;
  local_278.tm_gmtoff = local_e8.now.when.tm_gmtoff;
  local_278.tm_mon = local_e8.now.when.tm_mon;
  local_278.tm_year = local_e8.now.when.tm_year;
  local_278.tm_wday = local_e8.now.when.tm_wday;
  local_278.tm_yday = local_e8.now.when.tm_yday;
  local_278.tm_sec = local_e8.now.when.tm_sec;
  local_278.tm_min = local_e8.now.when.tm_min;
  local_278.tm_hour = local_e8.now.when.tm_hour;
  local_278.tm_mday = local_e8.now.when.tm_mday;
  tVar2 = mktime(&local_278);
  local_278.tm_zone = local_228.tm_zone;
  local_278.tm_isdst = local_228.tm_isdst;
  local_278._36_4_ = local_228._36_4_;
  local_278.tm_gmtoff = local_228.tm_gmtoff;
  local_278.tm_mon = local_228.tm_mon;
  local_278.tm_year = local_228.tm_year;
  local_278.tm_wday = local_228.tm_wday;
  local_278.tm_yday = local_228.tm_yday;
  local_278.tm_sec = local_228.tm_sec;
  local_278.tm_min = local_228.tm_min;
  local_278.tm_hour = local_228.tm_hour;
  local_278.tm_mday = local_228.tm_mday;
  tVar3 = mktime(&local_278);
  if (tVar2 != tVar3) {
    do {
      local_278.tm_zone = local_228.tm_zone;
      local_278.tm_isdst = local_228.tm_isdst;
      local_278._36_4_ = local_228._36_4_;
      local_278.tm_gmtoff = local_228.tm_gmtoff;
      local_278.tm_mon = local_228.tm_mon;
      local_278.tm_year = local_228.tm_year;
      local_278.tm_wday = local_228.tm_wday;
      local_278.tm_yday = local_228.tm_yday;
      local_278.tm_sec = local_228.tm_sec;
      local_278.tm_min = local_228.tm_min;
      local_278.tm_hour = local_228.tm_hour;
      local_278.tm_mday = local_228.tm_mday;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"* ",2);
      asap::operator<<((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                       (datetime *)&local_278);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      local_238 = local_180;
      uStack_230 = 0;
      local_228.tm_hour = local_228.tm_hour + (int)local_180;
      dVar1 = floor(local_180);
      local_238 = (local_238 - dVar1) * 60.0;
      dVar1 = floor(local_238);
      local_228._0_8_ =
           CONCAT44(local_228.tm_min + (int)local_238,
                    local_228.tm_sec + (int)((local_238 - dVar1) * 60.0));
      mktime(&local_228);
      local_278.tm_zone = local_228.tm_zone;
      local_278.tm_isdst = local_228.tm_isdst;
      local_278._36_4_ = local_228._36_4_;
      local_278.tm_gmtoff = local_228.tm_gmtoff;
      local_278.tm_mon = local_228.tm_mon;
      local_278.tm_year = local_228.tm_year;
      local_278.tm_wday = local_228.tm_wday;
      local_278.tm_yday = local_228.tm_yday;
      local_278.tm_sec = local_228.tm_sec;
      local_278.tm_min = local_228.tm_min;
      local_278.tm_hour = local_228.tm_hour;
      local_278.tm_mday = local_228.tm_mday;
      tVar2 = mktime(&local_278);
      local_278.tm_zone = local_188;
      local_278.tm_isdst = local_198;
      local_278._36_4_ = uStack_194;
      local_278.tm_gmtoff = lStack_190;
      local_278.tm_mon = local_1a8;
      local_278.tm_year = iStack_1a4;
      local_278.tm_wday = iStack_1a0;
      local_278.tm_yday = iStack_19c;
      local_278.tm_sec = (undefined4)local_1b8;
      local_278.tm_min = local_1b8._4_4_;
      local_278.tm_hour = (undefined4)lStack_1b0;
      local_278.tm_mday = lStack_1b0._4_4_;
      tVar3 = mktime(&local_278);
      if (tVar3 < tVar2) {
        local_228.tm_zone = local_188;
        local_228.tm_isdst = local_198;
        local_228._36_4_ = uStack_194;
        local_228.tm_gmtoff = lStack_190;
        local_228.tm_mon = local_1a8;
        local_228.tm_year = iStack_1a4;
        local_228.tm_wday = iStack_1a0;
        local_228.tm_yday = iStack_19c;
        local_228.tm_sec = (undefined4)local_1b8;
        local_228.tm_min = local_1b8._4_4_;
        local_228.tm_hour = (undefined4)lStack_1b0;
        local_228.tm_mday = lStack_1b0._4_4_;
      }
      local_278.tm_zone = local_e8.now.when.tm_zone;
      local_278.tm_isdst = local_e8.now.when.tm_isdst;
      local_278._36_4_ = local_e8.now.when._36_4_;
      local_278.tm_gmtoff = local_e8.now.when.tm_gmtoff;
      local_278.tm_mon = local_e8.now.when.tm_mon;
      local_278.tm_year = local_e8.now.when.tm_year;
      local_278.tm_wday = local_e8.now.when.tm_wday;
      local_278.tm_yday = local_e8.now.when.tm_yday;
      local_278.tm_sec = local_e8.now.when.tm_sec;
      local_278.tm_min = local_e8.now.when.tm_min;
      local_278.tm_hour = local_e8.now.when.tm_hour;
      local_278.tm_mday = local_e8.now.when.tm_mday;
      tVar2 = mktime(&local_278);
      local_278.tm_zone = local_228.tm_zone;
      local_278.tm_isdst = local_228.tm_isdst;
      local_278._36_4_ = local_228._36_4_;
      local_278.tm_gmtoff = local_228.tm_gmtoff;
      local_278.tm_mon = local_228.tm_mon;
      local_278.tm_year = local_228.tm_year;
      local_278.tm_wday = local_228.tm_wday;
      local_278.tm_yday = local_228.tm_yday;
      local_278.tm_sec = local_228.tm_sec;
      local_278.tm_min = local_228.tm_min;
      local_278.tm_hour = local_228.tm_hour;
      local_278.tm_mday = local_228.tm_mday;
      tVar3 = mktime(&local_278);
    } while (tVar2 != tVar3);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  /* Setting locale helps with local time format. It is not required. */
  setlocale(LC_ALL, "");

  /* Creates a period, from now until tomorrow. */
  auto period = asap::now().until(asap::tomorrow());

  /* Iterates from now until tomorrow, by every hour, using oldschool iterators.
   * Be aware that tomorrow happens to be next day *exactly* at midnight, which means
   * unless asap::now() is exactly at 0 minutes and 0 seconds, the next day will
   * never be printed. */
  auto everyhour = period.every(asap::hours(1));
  std::cout << "every hour until tomorrow:" << std::endl;
  for (auto i = everyhour.begin(); i != everyhour.end(); i++) {
    std::cout << "* " << *i << std::endl;
  }
  std::cout << std::endl;

  /* you can also use the newschool for :) */
  std::cout << "every 3 hours until tomorrow:" << std::endl;
  for (auto d: period.every(asap::hour(3))) {
    std::cout << "* " << d << std::endl;
  }

  return 0;
}